

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  Sphere *pSVar1;
  int i;
  int local_6c;
  uint in_stack_ffffffffffffff9c;
  RTCScene in_stack_ffffffffffffffa0;
  
  embree::sphereIntersectFuncPtr = embree::sphereIntersectFunc;
  embree::TutorialData_Constructor((TutorialData *)&embree::data);
  embree::g_scene = rtcNewScene(g_device);
  embree::data = embree::g_scene;
  _DAT_0060a408 = rtcNewScene(g_device);
  pSVar1 = embree::createAnalyticalSpheres(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  _DAT_0060a418 = pSVar1;
  *(undefined8 *)&(pSVar1->p).field_0 = 0;
  *(undefined8 *)((long)&(pSVar1->p).field_0 + 8) = 0;
  _DAT_0060a418->r = 1.0;
  rtcCommitScene(_DAT_0060a408);
  embree::g_instance_linear_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_linear_1 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_1 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_0,_DAT_0060a408);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_1,_DAT_0060a408);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_0,_DAT_0060a408);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_1,_DAT_0060a408);
  embree::updateTransformation();
  for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
    rtcAttachGeometry(embree::data,embree::g_instance_linear_0);
    rtcAttachGeometry(embree::data,embree::g_instance_linear_1);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_0);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_1);
  }
  rtcReleaseGeometry(embree::g_instance_linear_0);
  rtcReleaseGeometry(embree::g_instance_linear_1);
  rtcReleaseGeometry(embree::g_instance_quaternion_0);
  rtcReleaseGeometry(embree::g_instance_quaternion_1);
  rtcCommitGeometry(embree::g_instance_linear_0);
  rtcCommitGeometry(embree::g_instance_linear_1);
  rtcCommitGeometry(embree::g_instance_quaternion_0);
  rtcCommitGeometry(embree::g_instance_quaternion_1);
  rtcCommitScene(embree::data);
  _DAT_0060a410 = rtcGetSceneTraversable(embree::data);
  return;
}

Assistant:

void device_init (char* cfg)
{
  sphereIntersectFuncPtr = GET_FUNCTION_POINTER(sphereIntersectFunc);
  
  /* create scene */
  TutorialData_Constructor(&data);
  g_scene = data.g_scene = rtcNewScene(g_device);

  /* create scene with 4 analytical spheres */
  data.g_scene0 = rtcNewScene(g_device);
  data.g_spheres = createAnalyticalSpheres(data.g_scene0, 1);
  data.g_spheres[0].p = Vec3fa(0, 0, 0);
  data.g_spheres[0].r = 1.0f;
  rtcCommitScene(data.g_scene0);

  // attach multiple times otherwise Embree will optimize and not use
  // internal instancing (magic!)
  g_instance_linear_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_linear_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance_linear_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_linear_1, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_1, data.g_scene0);
  updateTransformation();
  for (int i = 0; i < 2; ++i)
  {
    rtcAttachGeometry(data.g_scene, g_instance_linear_0);
    rtcAttachGeometry(data.g_scene, g_instance_linear_1);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_0);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_1);
  }
  rtcReleaseGeometry(g_instance_linear_0);
  rtcReleaseGeometry(g_instance_linear_1);
  rtcReleaseGeometry(g_instance_quaternion_0);
  rtcReleaseGeometry(g_instance_quaternion_1);
  rtcCommitGeometry(g_instance_linear_0);
  rtcCommitGeometry(g_instance_linear_1);
  rtcCommitGeometry(g_instance_quaternion_0);
  rtcCommitGeometry(g_instance_quaternion_1);

  rtcCommitScene (data.g_scene);
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}